

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id,bool allow_alias)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ID local_2c;
  Meta *local_28;
  Meta *m;
  bool allow_alias_local;
  CompilerMSL *pCStack_18;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  m._3_1_ = allow_alias;
  m._4_4_ = id;
  pCStack_18 = this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  if ((this->super_CompilerGLSL).super_Compiler.current_function != (SPIRFunction *)0x0) {
    uVar1 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)
                       &(((this->super_CompilerGLSL).super_Compiler.current_function)->
                        super_IVariant).self);
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point)
    ;
    if (uVar1 == uVar2) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,m._4_4_);
      local_28 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,local_2c);
      if (((local_28 != (Meta *)0x0) &&
          (((local_28->decoration).qualified_alias_explicit_override & 1U) == 0)) &&
         (uVar3 = ::std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   (string *)&(local_28->decoration).qualified_alias);
        return __return_storage_ptr__;
      }
    }
  }
  Compiler::to_name_abi_cxx11_(__return_storage_ptr__,(Compiler *)this,m._4_4_,(bool)(m._3_1_ & 1));
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_name(uint32_t id, bool allow_alias) const
{
	if (current_function && (current_function->self == ir.default_entry_point))
	{
		auto *m = ir.find_meta(id);
		if (m && !m->decoration.qualified_alias_explicit_override && !m->decoration.qualified_alias.empty())
			return m->decoration.qualified_alias;
	}
	return Compiler::to_name(id, allow_alias);
}